

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall CP::list<int>::print(list<int> *this)

{
  ostream *poVar1;
  node *pnVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Size ",5);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  pnVar2 = this->mHeader->next;
  if (this->mHeader != pnVar2) {
    do {
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pnVar2->data);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
      pnVar2 = pnVar2->next;
    } while (this->mHeader != pnVar2);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x68);
  std::ostream::put(-0x68);
  std::ostream::flush();
  return;
}

Assistant:

void print() {
      std::cout << "Size " << mSize << ": ";
      int i = 0;
      iterator before;
      for (iterator it = begin();it!=end();before = it, it++,i++) {
        std::cout << *it << " ";
      }
      std::cout << std::endl;
    }